

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_ClippingRegionPoints::AppendClipPoints
          (ON_ClippingRegionPoints *this,ON_ClippingRegion *clipping_region,size_t world_point_count
          ,size_t world_point_stride,double *world_points)

{
  ON_3dPoint clip_point_00;
  double *P1;
  ON_3dPoint clip_point;
  ON_3dPoint *pOStack_40;
  uint clip_flags;
  double *P;
  double *world_points_local;
  size_t world_point_stride_local;
  size_t world_point_count_local;
  ON_ClippingRegion *clipping_region_local;
  ON_ClippingRegionPoints *this_local;
  
  if (world_point_count == 0) {
    this_local._7_1_ = true;
  }
  else if ((world_point_stride < 3) || (world_points == (double *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    for (pOStack_40 = (ON_3dPoint *)world_points;
        pOStack_40 < (ON_3dPoint *)(world_points + world_point_stride * world_point_count);
        pOStack_40 = (ON_3dPoint *)(&pOStack_40->x + world_point_stride)) {
      clip_point.z._4_4_ =
           ON_ClippingRegion::TransformPoint(clipping_region,pOStack_40,(ON_3dPoint *)&P1);
      clip_point_00.y = clip_point.x;
      clip_point_00.x = (double)P1;
      clip_point_00.z = clip_point.y;
      AppendClipPoint(this,clip_point_00,clip_point.z._4_4_);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ClippingRegionPoints::AppendClipPoints(
  const class ON_ClippingRegion& clipping_region,
  size_t world_point_count,
  size_t world_point_stride,
  const double* world_points
  )
{
  if ( 0 == world_point_count )
    return true;
  if (world_point_stride < 3 || nullptr == world_points )
    return false;
  const double* P = world_points;
  unsigned int clip_flags;
  ON_3dPoint clip_point;
  for (const double* P1 = world_points + world_point_stride*world_point_count; P < P1; P += world_point_stride)
  {
    clip_flags = clipping_region.TransformPoint(*((const ON_3dPoint*)P),clip_point);
    AppendClipPoint(clip_point,clip_flags);
  }
  return true;
}